

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_function
          (Dispatch_Engine *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
          *f)

{
  ostream *poVar1;
  Type_Info *pTVar2;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> params;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_38;
  
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_38,
             &((f->second).
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_types);
  dump_type(this,local_38._M_impl.super__Vector_impl_data._M_start);
  poVar1 = std::operator<<((ostream *)&std::cout," ");
  poVar1 = std::operator<<(poVar1,(string *)f);
  std::operator<<(poVar1,"(");
  for (pTVar2 = local_38._M_impl.super__Vector_impl_data._M_start + 2;
      pTVar2 + -1 != local_38._M_impl.super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
    dump_type(this,pTVar2 + -1);
    if (pTVar2 != local_38._M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<((ostream *)&std::cout,", ");
    }
  }
  std::operator<<((ostream *)&std::cout,") \n");
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_38);
  return;
}

Assistant:

void dump_function(const std::pair<const std::string, Proxy_Function> &f) const {
        const auto params = f.second->get_param_types();

        dump_type(params.front());
        std::cout << " " << f.first << "(";

        for (auto itr = params.begin() + 1; itr != params.end();) {
          dump_type(*itr);
          ++itr;

          if (itr != params.end()) {
            std::cout << ", ";
          }
        }

        std::cout << ") \n";
      }